

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
libcellml::Units::addUnit
          (Units *this,string *reference,int prefix,double exponent,double multiplier,string *id)

{
  string local_40;
  
  convertToString_abi_cxx11_(&local_40,(libcellml *)(ulong)(uint)prefix,prefix);
  addUnit(this,reference,&local_40,exponent,multiplier,id);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Units::addUnit(const std::string &reference, int prefix, double exponent,
                    double multiplier, const std::string &id)
{
    addUnit(reference, convertToString(prefix), exponent, multiplier, id);
}